

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<-10>,_boost::random::detail::M3<-19>,_boost::random::detail::M2<-11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<-10>,_boost::random::detail::no_tempering>,_421390442U>
     ::run(void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_bd0;
  basic_cstring<const_char> local_bc0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bb0;
  assertion_result local_b90;
  basic_cstring<const_char> local_b78;
  basic_cstring<const_char> local_b68;
  basic_cstring<const_char> local_b58;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b48;
  basic_cstring<const_char> local_b20;
  basic_cstring<const_char> local_b10;
  undefined4 local_b00;
  result_type local_afc;
  basic_cstring<const_char> local_af8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ae8;
  basic_cstring<const_char> local_ac0;
  basic_cstring<const_char> local_ab0;
  undefined4 local_aa0;
  result_type local_a9c;
  basic_cstring<const_char> local_a98;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a88;
  basic_cstring<const_char> local_a60;
  basic_cstring<const_char> local_a50;
  undefined4 local_a3c;
  result_type local_a38 [4];
  basic_cstring<const_char> local_a28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a18;
  basic_cstring<const_char> local_9f0;
  basic_cstring<const_char> local_9e0;
  undefined1 local_9d0 [8];
  WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<_10>,_boost::random::detail::M3<_19>,_boost::random::detail::M2<_11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<_10>,_boost::random::detail::no_tempering>,_421390442U>
  c;
  
  WellTestCase((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<_10>,_boost::random::detail::M3<_19>,_boost::random::detail::M2<_11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<_10>,_boost::random::detail::no_tempering>,_421390442U>
                *)local_9d0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9e0,0x43,&local_9f0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a18,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_a38[0] = generate((WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<_10>,_boost::random::detail::M3<_19>,_boost::random::detail::M2<_11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<_10>,_boost::random::detail::no_tempering>,_421390442U>
                             *)local_9d0);
    local_a3c = 0x191de86a;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_a18,&local_a28,0x43,1,2,local_a38,"c.generate()",&local_a3c,"Expected");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a60);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a50,0x44,&local_a60);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a88,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_a9c = boost::random::
                well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<-10>,_boost::random::detail::M3<-19>,_boost::random::detail::M2<-11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<-10>,_boost::random::detail::no_tempering>
                ::min();
    local_aa0 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_a88,&local_a98,0x44,1,2,&local_a9c,"c.rng.min()",&local_aa0,"0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ac0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ab0,0x45,&local_ac0);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ae8,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_af8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    local_afc = boost::random::
                well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<-10>,_boost::random::detail::M3<-19>,_boost::random::detail::M2<-11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<-10>,_boost::random::detail::no_tempering>
                ::max();
    local_b00 = 0xffffffff;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_ae8,&local_af8,0x45,1,2,&local_afc,"c.rng.max()",&local_b00,"~0U");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ae8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b20);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b10,0x46,&local_b20);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b48,plVar3,(char (*) [1])0x15b00a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,boost::random::well_engine<unsigned_int,32ul,624ul,31ul,203ul,613ul,123ul,boost::random::detail::M3<7>,boost::random::detail::M1,boost::random::detail::M3<12>,boost::random::detail::M3<_10>,boost::random::detail::M3<_19>,boost::random::detail::M2<_11>,boost::random::detail::M3<4>,boost::random::detail::M3<_10>,boost::random::detail::no_tempering>,boost::random::well_engine<unsigned_int,32ul,624ul,31ul,203ul,613ul,123ul,boost::random::detail::M3<7>,boost::random::detail::M1,boost::random::detail::M3<12>,boost::random::detail::M3<_10>,boost::random::detail::M3<_19>,boost::random::detail::M2<_11>,boost::random::detail::M3<4>,boost::random::detail::M3<_10>,boost::random::detail::no_tempering>>
              (&local_b48,&local_b58,0x46,1,2,local_9d0,"c.rng",local_9d0,"c.rng");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b48);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b78);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b68,0x47,&local_b78);
    bVar2 = boost::random::operator==
                      ((well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<_10>,_boost::random::detail::M3<_19>,_boost::random::detail::M2<_11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<_10>,_boost::random::detail::no_tempering>
                        *)local_9d0,
                       (well_engine<unsigned_int,_32UL,_624UL,_31UL,_203UL,_613UL,_123UL,_boost::random::detail::M3<7>,_boost::random::detail::M1,_boost::random::detail::M3<12>,_boost::random::detail::M3<_10>,_boost::random::detail::M3<_19>,_boost::random::detail::M2<_11>,_boost::random::detail::M3<4>,_boost::random::detail::M3<_10>,_boost::random::detail::no_tempering>
                        *)local_9d0);
    boost::test_tools::assertion_result::assertion_result(&local_b90,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc0,"c.rng == c.rng",0xe);
    boost::unit_test::operator<<(&local_bb0,plVar3,&local_bc0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bd0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sergiud[P]random/tests/well/main.cpp"
               ,0x5b);
    boost::test_tools::tt_detail::report_assertion(&local_b90,&local_bb0,&local_bd0,0x47,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bb0);
    boost::test_tools::assertion_result::~assertion_result(&local_b90);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

static void run()
    {
        WellTestCase c;

        BOOST_CHECK_EQUAL(c.generate(), Expected);
        BOOST_CHECK_EQUAL(c.rng.min(), 0U);
        BOOST_CHECK_EQUAL(c.rng.max(), ~0U);
        BOOST_CHECK_EQUAL(c.rng, c.rng);
        BOOST_CHECK(c.rng == c.rng);
    }